

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger class_rawnewmember(HSQUIRRELVM v)

{
  SQInteger SVar1;
  SQRESULT SVar2;
  SQBool bstatic;
  SQBool local_18;
  
  SVar1 = sq_gettop(v);
  local_18 = 0;
  if (SVar1 == 5) {
    sq_tobool(v,-1,&local_18);
    sq_pop(v,1);
  }
  if (SVar1 < 4) {
    sq_pushnull(v);
  }
  SVar2 = sq_rawnewmember(v,-4,local_18);
  return SVar2 >> 0x3f | 1;
}

Assistant:

static SQInteger class_rawnewmember(HSQUIRRELVM v)
{
    SQInteger top = sq_gettop(v);
    SQBool bstatic = SQFalse;
    if(top == 5)
    {
        sq_tobool(v,-1,&bstatic);
        sq_pop(v,1);
    }

    if(top < 4) {
        sq_pushnull(v);
    }
    return SQ_SUCCEEDED(sq_rawnewmember(v,-4,bstatic))?1:SQ_ERROR;
}